

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cpp
# Opt level: O3

void __thiscall Bmp::save(Bmp *this,string *file)

{
  bool bVar1;
  FILE *__s;
  ulong uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  __s = fopen((file->_M_dataplus)._M_p,"wb");
  fwrite(&this->m_bf,1,0xe,__s);
  fwrite(&this->m_bi,1,0x28,__s);
  if (0 < (long)this->m_h) {
    uVar2 = (ulong)(uint)this->m_w;
    lVar5 = (long)this->m_h;
    do {
      lVar6 = lVar5 + -1;
      if (0 < (int)uVar2) {
        lVar4 = 0;
        do {
          fputc((int)(char)this->m_data[lVar4][lVar6].b,__s);
          fputc((int)(char)this->m_data[lVar4][lVar6].g,__s);
          fputc((int)(char)this->m_data[lVar4][lVar6].r,__s);
          lVar4 = lVar4 + 1;
          uVar2 = (ulong)this->m_w;
        } while (lVar4 < (long)uVar2);
      }
      if ((uVar2 & 0x80000003) != 0 && -1 < (int)uVar2) {
        iVar3 = 0;
        do {
          fputc(0,__s);
          iVar3 = iVar3 + 1;
          uVar2 = (ulong)(uint)this->m_w;
        } while (iVar3 < this->m_w % 4);
      }
      bVar1 = 1 < lVar5;
      lVar5 = lVar6;
    } while (bVar1);
  }
  fclose(__s);
  return;
}

Assistant:

void Bmp::save(const std::string& file) const
{
    FILE* f = fopen(file.c_str(), "wb");

    fwrite(&m_bf, 1, sizeof(BITMAPFILEHEADER), f);
    fwrite(&m_bi, 1, sizeof(BITMAPINFOHEADER), f);
    for (int j = m_h - 1; j >= 0; j--)
    {
        for (int i = 0; i < m_w; i++)
        {
            fwrite(&m_data[i][j].b, 1, sizeof(byte), f);
            fwrite(&m_data[i][j].g, 1, sizeof(byte), f);
            fwrite(&m_data[i][j].r, 1, sizeof(byte), f);
        }
        for (int i = 0; i < m_w % 4; i++) fputc(0, f);
    }

    fclose(f);
}